

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d0ce::TestTestWithUnspecifiedSuiteGetsDefaultSuite::RunImpl
          (TestTestWithUnspecifiedSuiteGetsDefaultSuite *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_b8 [2];
  TestDetails local_78;
  undefined1 local_48 [8];
  Test test;
  TestTestWithUnspecifiedSuiteGetsDefaultSuite *this_local;
  
  test._48_8_ = this;
  UnitTest::Test::Test((Test *)local_48,"test","DefaultSuite","",0);
  bVar2 = UnitTest::Check<bool>(test._vptr_Test != (_func_int **)0x0);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_78,*ppTVar4,0x66);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_78,"test.m_details.suiteName != NULL");
  }
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar3;
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_b8,*ppTVar4,0x67);
  UnitTest::CheckEqual(pTVar1,"DefaultSuite",(char *)test._vptr_Test,local_b8);
  UnitTest::Test::~Test((Test *)local_48);
  return;
}

Assistant:

TEST(TestWithUnspecifiedSuiteGetsDefaultSuite)
{
    Test test("test");
    CHECK(test.m_details.suiteName != NULL);
    CHECK_EQUAL("DefaultSuite", test.m_details.suiteName);
}